

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_line_base.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
assert_line_base(assert_line_base<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                 *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_class_type cVar1;
  char_type cVar2;
  
  cVar1 = lookup_classname<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,8ul>
                    (tr,(char (*) [8])"newline",false);
  this->newline_ = cVar1;
  cVar2 = cpp_regex_traits<char>::widen(&tr->super_cpp_regex_traits<char>,'\n');
  this->nl_ = cVar2;
  cVar2 = cpp_regex_traits<char>::widen(&tr->super_cpp_regex_traits<char>,'\r');
  this->cr_ = cVar2;
  return;
}

Assistant:

assert_line_base(Traits const &tr)
            : newline_(lookup_classname(tr, "newline"))
            , nl_(tr.widen('\n'))
            , cr_(tr.widen('\r'))
        {
        }